

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O1

void __thiscall
wasm::ReconstructStringifyWalker::ReconstructStringifyWalker
          (ReconstructStringifyWalker *this,Module *wasm,Function *func)

{
  (this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).
  super_PostWalker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
  .
  super_Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
  .replacep = (Expression **)0x0;
  (this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).
  super_PostWalker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
  .
  super_Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
  .stack.usedFixed = 0;
  (this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).
  super_PostWalker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
  .
  super_Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).
           super_PostWalker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
           .
           super_Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
           .stack.flexible.
           super__Vector_base<wasm::Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>::Task>_>
           ._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).
           super_PostWalker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
           .
           super_Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
           .stack.flexible.
           super__Vector_base<wasm::Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>::Task>_>
           ._M_impl + 0x10) = (pointer)0x0;
  (this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).
  super_PostWalker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
  .
  super_Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
  .currFunction = (Function *)0x0;
  (this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).
  super_PostWalker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
  .
  super_Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
  .currModule = (Module *)0x0;
  (this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).controlFlowQueue.c.
  super__Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).controlFlowQueue.c.
  super__Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).controlFlowQueue.c.
  super__Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).controlFlowQueue.c.
           super__Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
           super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).controlFlowQueue.c.
           super__Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
           super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).controlFlowQueue.c.
           super__Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
           super__Deque_impl_data._M_start + 0x18) = (_Map_pointer)0x0;
  (this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).controlFlowQueue.c.
  super__Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).controlFlowQueue.c.
           super__Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
           super__Deque_impl_data._M_finish + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).controlFlowQueue.c.
           super__Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
           super__Deque_impl_data._M_finish + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).controlFlowQueue.c.
           super__Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
           super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
  std::_Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::_M_initialize_map
            ((_Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
             &(this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).controlFlowQueue,0);
  this->state = NotInSeq;
  (this->sequences).
  super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sequences).
  super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sequences).
  super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->seqCounter = 0;
  this->instrCounter = 0;
  (this->existingBuilder).wasm = wasm;
  (this->existingBuilder).func = (Function *)0x0;
  (this->existingBuilder).builder.wasm = wasm;
  *(__index_type *)
   ((long)&(this->existingBuilder).debugLoc.
           super__Variant_base<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
           .
           super__Move_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
           .
           super__Copy_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
           .
           super__Move_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
           .
           super__Copy_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
   + 0x14) = '\0';
  (this->existingBuilder).scopeStack.
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->existingBuilder).scopeStack.
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->existingBuilder).scopeStack.
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->existingBuilder).binaryPos = (size_t *)0x0;
  (this->existingBuilder).lastBinaryPos = 0;
  (this->existingBuilder).codeSectionOffset = 0;
  (this->existingBuilder).labelDepths._M_h._M_buckets =
       &(this->existingBuilder).labelDepths._M_h._M_single_bucket;
  (this->existingBuilder).labelDepths._M_h._M_bucket_count = 1;
  (this->existingBuilder).labelDepths._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->existingBuilder).labelDepths._M_h._M_element_count = 0;
  (this->existingBuilder).labelDepths._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->existingBuilder).labelDepths._M_h._M_rehash_policy._M_next_resize = 0;
  (this->existingBuilder).labelDepths._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->existingBuilder).blockHint = 0;
  (this->existingBuilder).labelHint = 0;
  (this->outlinedBuilder).wasm = wasm;
  (this->outlinedBuilder).func = (Function *)0x0;
  (this->outlinedBuilder).builder.wasm = wasm;
  *(__index_type *)
   ((long)&(this->outlinedBuilder).debugLoc.
           super__Variant_base<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
           .
           super__Move_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
           .
           super__Copy_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
           .
           super__Move_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
           .
           super__Copy_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
   + 0x14) = '\0';
  (this->outlinedBuilder).scopeStack.
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->outlinedBuilder).scopeStack.
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->outlinedBuilder).scopeStack.
  super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->outlinedBuilder).codeSectionOffset = 0;
  (this->outlinedBuilder).binaryPos = (size_t *)0x0;
  (this->outlinedBuilder).lastBinaryPos = 0;
  (this->outlinedBuilder).labelDepths._M_h._M_buckets =
       &(this->outlinedBuilder).labelDepths._M_h._M_single_bucket;
  (this->outlinedBuilder).labelDepths._M_h._M_bucket_count = 1;
  (this->outlinedBuilder).labelDepths._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->outlinedBuilder).labelDepths._M_h._M_element_count = 0;
  (this->outlinedBuilder).labelDepths._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->outlinedBuilder).labelDepths._M_h._M_rehash_policy._M_next_resize = 0;
  (this->outlinedBuilder).labelDepths._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->outlinedBuilder).blockHint = 0;
  (this->outlinedBuilder).labelHint = 0;
  this->func = func;
  (this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).
  super_PostWalker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
  .
  super_Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
  .currModule = wasm;
  return;
}

Assistant:

ReconstructStringifyWalker(Module* wasm, Function* func)
    : existingBuilder(*wasm), outlinedBuilder(*wasm), func(func) {
    this->setModule(wasm);
    ODBG(std::cerr << "\nexistingBuilder: " << &existingBuilder
                   << " outlinedBuilder: " << &outlinedBuilder << "\n");
  }